

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

bool __thiscall
r_comp::Class::get_member_index
          (Class *this,Metadata *metadata,string *name,uint16_t *index,Class **p)

{
  pointer pSVar1;
  pointer __s2;
  size_t __n;
  char cVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  Class *pCVar8;
  ushort uVar9;
  ulong uVar10;
  
  pSVar1 = (this->things_to_read).
           super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->things_to_read).
                super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
  if (lVar6 != 0) {
    uVar10 = (lVar6 >> 5) * -0x5555555555555555;
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    uVar7 = 0;
    uVar9 = 0;
    do {
      if ((pSVar1[uVar7].name._M_string_length == __n) &&
         ((__n == 0 || (iVar5 = bcmp(pSVar1[uVar7].name._M_dataplus._M_p,__s2,__n), iVar5 == 0)))) {
        cVar2 = r_code::Atom::getDescriptor();
        if ((byte)(cVar2 + 0x3eU) < 9) {
          sVar4 = *(short *)(&DAT_0013e060 + (ulong)(byte)(cVar2 + 0x3eU) * 2);
        }
        else {
          sVar4 = 0;
        }
        *index = sVar4 + uVar9;
        bVar3 = StructureMember::used_as_expression
                          ((this->things_to_read).
                           super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar7);
        if (bVar3) {
          pCVar8 = (Class *)0x0;
        }
        else {
          pCVar8 = StructureMember::get_class
                             ((this->things_to_read).
                              super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar7,metadata);
        }
        *p = pCVar8;
        return true;
      }
      uVar9 = uVar9 + 1;
      uVar7 = (ulong)uVar9;
    } while (uVar7 <= uVar10 && uVar10 - uVar7 != 0);
  }
  return false;
}

Assistant:

bool Class::get_member_index(Metadata *metadata, std::string &name, uint16_t &index, Class *&p) const
{
    for (uint16_t i = 0; i < things_to_read.size(); ++i)
        if (things_to_read[i].name == name) {
            index = (has_offset() ? i + 1 : i); // in expressions the lead r-atom is at 0; in objects, members start at 1

            if (things_to_read[i].used_as_expression()) { // the class is: [::a-class]
                p = nullptr;
            } else {
                p = things_to_read[i].get_class(metadata);
            }

            return true;
        }

    return false;
}